

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void * SySetPop(SySet *pSet)

{
  sxu32 sVar1;
  
  if (pSet->nUsed != 0) {
    sVar1 = pSet->nUsed - 1;
    pSet->nUsed = sVar1;
    return (void *)((ulong)(sVar1 * pSet->eSize) + (long)pSet->pBase);
  }
  return (void *)0x0;
}

Assistant:

JX9_PRIVATE void * SySetPop(SySet *pSet)
{
	const char *zBase;
	void *pData;
	if( pSet->nUsed <= 0 ){
		return 0;
	}
	zBase = (const char *)pSet->pBase;
	pSet->nUsed--;
	pData =  (void *)&zBase[pSet->nUsed * pSet->eSize]; 
	return pData;
}